

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>
          (Parser *this,DeclarationSyntax **decl,SpecifierSyntax **spec,SyntaxKind declK,
          SyntaxKind specK,offset_in_Parser_to_subr parseMember)

{
  SyntaxKind SVar1;
  SyntaxToken *pSVar2;
  ostream *poVar3;
  TagTypeSpecifierSyntax *pTVar4;
  ulong uVar5;
  SyntaxNodePlainList<psy::C::DeclarationSyntax_*> *pSVar6;
  long *plVar7;
  code *in_stack_00000008;
  long in_stack_00000010;
  code *local_a8;
  DeclarationSyntax *local_78;
  DeclarationSyntax *membDecl;
  DeclarationListSyntax **declList_cur;
  anon_class_32_4_06b38f02 wrapTySpecInTyDecl;
  TagTypeSpecifierSyntax *tySpec;
  offset_in_Parser_to_subr parseMember_local;
  SyntaxKind local_2c;
  SyntaxKind local_2a;
  SyntaxKind specK_local;
  SpecifierSyntax **ppSStack_28;
  SyntaxKind declK_local;
  SpecifierSyntax **spec_local;
  DeclarationSyntax **decl_local;
  Parser *this_local;
  
  local_2c = specK;
  local_2a = declK;
  ppSStack_28 = spec;
  spec_local = (SpecifierSyntax **)decl;
  decl_local = (DeclarationSyntax **)this;
  pSVar2 = peek(this,1);
  SVar1 = SyntaxToken::kind(pSVar2);
  if (SVar1 != Keyword_struct) {
    pSVar2 = peek(this,1);
    SVar1 = SyntaxToken::kind(pSVar2);
    if (SVar1 != Keyword_union) {
      pSVar2 = peek(this,1);
      SVar1 = SyntaxToken::kind(pSVar2);
      if (SVar1 != Keyword_enum) goto LAB_0040b96b;
    }
  }
  if ((((local_2a == StructDeclaration) || (local_2a == UnionDeclaration)) ||
      (local_2a == EnumDeclaration)) &&
     (((local_2c == StructTypeSpecifier || (local_2c == UnionTypeSpecifier)) ||
      (local_2c == EnumTypeSpecifier)))) {
    wrapTySpecInTyDecl.tySpec =
         (TagTypeSpecifierSyntax **)
         makeNode<psy::C::TagTypeSpecifierSyntax,psy::C::SyntaxKind&>(this,&local_2c);
    *ppSStack_28 = (SpecifierSyntax *)wrapTySpecInTyDecl.tySpec;
    pTVar4 = (TagTypeSpecifierSyntax *)consume(this);
    wrapTySpecInTyDecl.tySpec[3] = pTVar4;
    pSVar2 = peek(this,1);
    SVar1 = SyntaxToken::kind(pSVar2);
    if (SVar1 == KeywordAlias___attribute) {
      parseExtGNU_AttributeSpecifierList_AtFirst
                (this,(SpecifierListSyntax **)(wrapTySpecInTyDecl.tySpec + 4));
    }
    declList_cur = (DeclarationListSyntax **)&local_2a;
    wrapTySpecInTyDecl.this = (Parser *)spec_local;
    wrapTySpecInTyDecl.decl = (DeclarationSyntax **)&wrapTySpecInTyDecl.tySpec;
    wrapTySpecInTyDecl.declK = (SyntaxKind *)this;
    pSVar2 = peek(this,1);
    SVar1 = SyntaxToken::kind(pSVar2);
    if (SVar1 == IdentifierToken) {
      pTVar4 = (TagTypeSpecifierSyntax *)consume(this);
      wrapTySpecInTyDecl.tySpec[5] = pTVar4;
      pSVar2 = peek(this,1);
      SVar1 = SyntaxToken::kind(pSVar2);
      if (SVar1 != OpenBraceToken) {
        if ((SVar1 == SemicolonToken) &&
           ((local_2c == StructTypeSpecifier || (local_2c == UnionTypeSpecifier)))) {
          parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>::anon_class_32_4_06b38f02::
          operator()((anon_class_32_4_06b38f02 *)&declList_cur);
          return true;
        }
        return true;
      }
      pTVar4 = (TagTypeSpecifierSyntax *)consume(this);
      wrapTySpecInTyDecl.tySpec[6] = pTVar4;
    }
    else {
      if (SVar1 != OpenBraceToken) {
        DiagnosticsReporter::ExpectedFollowOfStructOrUnionOrEnum(&this->diagReporter_);
        return false;
      }
      pTVar4 = (TagTypeSpecifierSyntax *)consume(this);
      wrapTySpecInTyDecl.tySpec[6] = pTVar4;
    }
    parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>::anon_class_32_4_06b38f02::
    operator()((anon_class_32_4_06b38f02 *)&declList_cur);
    membDecl = (DeclarationSyntax *)(wrapTySpecInTyDecl.tySpec + 7);
    do {
      local_78 = (DeclarationSyntax *)0x0;
      pSVar2 = peek(this,1);
      SVar1 = SyntaxToken::kind(pSVar2);
      if (SVar1 == CloseBraceToken) {
        pTVar4 = (TagTypeSpecifierSyntax *)consume(this);
        wrapTySpecInTyDecl.tySpec[8] = pTVar4;
        pSVar2 = peek(this,1);
        SVar1 = SyntaxToken::kind(pSVar2);
        if (SVar1 == KeywordAlias___attribute) {
          parseExtGNU_AttributeSpecifierList_AtFirst
                    (this,(SpecifierListSyntax **)(wrapTySpecInTyDecl.tySpec + 9));
        }
        return true;
      }
      plVar7 = (long *)((long)&this->pool_ + in_stack_00000010);
      if (((ulong)in_stack_00000008 & 1) == 0) {
        local_a8 = in_stack_00000008;
      }
      else {
        local_a8 = *(code **)(in_stack_00000008 + *plVar7 + -1);
      }
      uVar5 = (*local_a8)(plVar7,&local_78);
      if ((uVar5 & 1) == 0) {
        ignoreMemberDeclaration(this);
        pSVar2 = peek(this,1);
        SVar1 = SyntaxToken::kind(pSVar2);
        if (SVar1 == EndOfFile) {
          return false;
        }
      }
      pSVar6 = makeNode<psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>,psy::C::DeclarationSyntax*&>
                         (this,&local_78);
      (membDecl->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pSVar6;
      membDecl = (DeclarationSyntax *)((membDecl->super_SyntaxNode).super_Managed._vptr_Managed + 2)
      ;
    } while( true );
  }
LAB_0040b96b:
  poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x600);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"assert failure: `struct\', `union\', or `enum\'");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool Parser::parseTagTypeSpecifier_AtFirst(
        DeclarationSyntax*& decl,
        SpecifierSyntax*& spec,
        SyntaxKind declK,
        SyntaxKind specK,
        bool (Parser::*parseMember)(DeclarationSyntax*&))
{
    DBG_THIS_RULE();
    PSY_ASSERT_3((peek().kind() == SyntaxKind::Keyword_struct
                        || peek().kind() == SyntaxKind::Keyword_union
                        || peek().kind() == SyntaxKind::Keyword_enum)
                    && (declK == SyntaxKind::StructDeclaration
                        || declK == SyntaxKind::UnionDeclaration
                        || declK == SyntaxKind::EnumDeclaration)
                    && (specK == SyntaxKind::StructTypeSpecifier
                        || specK == SyntaxKind::UnionTypeSpecifier
                        || specK == SyntaxKind::EnumTypeSpecifier),
                  return false,
                  "assert failure: `struct', `union', or `enum'");

    auto tySpec = makeNode<TagTypeSpecifierSyntax>(specK);
    spec = tySpec;
    tySpec->kwTkIdx_ = consume();

    if (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__)
        parseExtGNU_AttributeSpecifierList_AtFirst(tySpec->attrs1_);

    auto wrapTySpecInTyDecl = [&]() {
        auto tyDecl = makeNode<TypeDeclT>(declK);
        decl = tyDecl;
        tyDecl->typeSpec_ = tySpec;
    };

    switch (peek().kind()) {
        case SyntaxKind::OpenBraceToken:
            tySpec->openBraceTkIdx_ = consume();
            break;

        case SyntaxKind::IdentifierToken:
            tySpec->tagTkIdx_ = consume();
            switch (peek().kind()) {
                case SyntaxKind::OpenBraceToken:
                    tySpec->openBraceTkIdx_ = consume();
                    break;

                case SyntaxKind::SemicolonToken:
                    if (specK == SyntaxKind::StructTypeSpecifier
                            || specK == SyntaxKind::UnionTypeSpecifier) {
                        wrapTySpecInTyDecl();
                        return true;
                    }
                    [[fallthrough]];

                default:
                    return true;
            }
            break;

        default:
            diagReporter_.ExpectedFollowOfStructOrUnionOrEnum();
            return false;
    }

    wrapTySpecInTyDecl();

    DeclarationListSyntax** declList_cur = &tySpec->decls_;

    while (true) {
        DeclarationSyntax* membDecl = nullptr;
        switch (peek().kind()) {
            case SyntaxKind::CloseBraceToken:
                tySpec->closeBraceTkIdx_ = consume();
                goto MembersParsed;

            default:
                if (!((this)->*(parseMember))(membDecl)) {
                    ignoreMemberDeclaration();
                    if (peek().kind() == SyntaxKind::EndOfFile)
                        return false;
                }
                break;
        }
        *declList_cur = makeNode<DeclarationListSyntax>(membDecl);
        declList_cur = &(*declList_cur)->next;
    }

MembersParsed:
    if (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__)
        parseExtGNU_AttributeSpecifierList_AtFirst(tySpec->attrs2_);

    return true;
}